

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void __thiscall
duckdb::BitpackingCompressionState<long,_true,_long>::Append
          (BitpackingCompressionState<long,_true,_long> *this,UnifiedVectorFormat *vdata,idx_t count
          )

{
  long *plVar1;
  idx_t value;
  BitpackingState<long,_long> *in_RDX;
  UnifiedVectorFormat *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  idx_t idx;
  idx_t i;
  long *data;
  BitpackingState<long,_long> *this_00;
  
  plVar1 = UnifiedVectorFormat::GetData<long>(in_RSI);
  for (this_00 = (BitpackingState<long,_long> *)0x0; this_00 < in_RDX;
      this_00 = (BitpackingState<long,_long> *)((long)this_00->compression_buffer_internal + 1)) {
    value = SelectionVector::get_index(in_RSI->sel,(idx_t)this_00);
    TemplatedValidityMask<unsigned_long>::RowIsValid(in_RDI,plVar1[value]);
    BitpackingState<long,long>::
    Update<duckdb::BitpackingCompressionState<long,true,long>::BitpackingWriter>
              (this_00,value,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return;
}

Assistant:

void Append(UnifiedVectorFormat &vdata, idx_t count) {
		auto data = UnifiedVectorFormat::GetData<T>(vdata);

		for (idx_t i = 0; i < count; i++) {
			idx_t idx = vdata.sel->get_index(i);
			state.template Update<BitpackingCompressionState<T, WRITE_STATISTICS, T_S>::BitpackingWriter>(
			    data[idx], vdata.validity.RowIsValid(idx));
		}
	}